

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermAggregate * __thiscall
glslang::HlslParseContext::handleSamplerTextureCombine
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *argTex,TIntermTyped *argSampler)

{
  mapped_type ptVar1;
  byte bVar2;
  TIntermTyped *pTVar3;
  bool bVar4;
  int iVar5;
  HlslParseContext *pHVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar8;
  _Base_ptr p_Var9;
  pointer ppVar10;
  tShadowTextureSymbols *ptVar11;
  mapped_type *pptVar12;
  undefined4 extraout_var_05;
  TSampler *pTVar13;
  TQualifier *qualifier;
  TString *name;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uint uVar14;
  tShadowTextureSymbols tVar15;
  TType local_1e0;
  key_type_conflict2 local_148;
  _Self local_140;
  _Self local_138;
  TVariable *local_130;
  TVariable *newTexture;
  TType texType;
  tShadowTextureSymbols local_88;
  _Self local_78;
  key_type_conflict2 local_70;
  _Self local_68;
  iterator textureShadowEntry;
  longlong newId;
  TIntermSymbol *texSymbol;
  bool shadowMode;
  TIntermAggregate *pTStack_48;
  TSampler samplerType;
  TIntermTyped *local_40;
  HlslParseContext *local_38;
  TIntermAggregate *txcombine;
  TIntermTyped *argSampler_local;
  TIntermTyped *argTex_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  txcombine = (TIntermAggregate *)argSampler;
  argSampler_local = argTex;
  argTex_local = (TIntermTyped *)loc;
  loc_local = (TSourceLoc *)this;
  pHVar6 = (HlslParseContext *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)loc);
  TIntermAggregate::TIntermAggregate((TIntermAggregate *)pHVar6,EOpConstructTextureSampler);
  local_38 = pHVar6;
  iVar5 = (*((TIntermNode *)
            &(pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)->
            _vptr_TIntermNode[0x32])();
  local_40 = argSampler_local;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var,iVar5),(value_type *)&local_40);
  iVar5 = (*((TIntermNode *)
            &(local_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)->
            _vptr_TIntermNode[0x32])();
  pTStack_48 = txcombine;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var_00,iVar5),(value_type *)&stack0xffffffffffffffb8);
  iVar5 = (*(argSampler_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  puVar7 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x40))();
  texSymbol._4_4_ = *puVar7 & 0xffefffff | 0x100000;
  iVar5 = (*(txcombine->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x1e])();
  puVar7 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x40))();
  texSymbol._3_1_ = (byte)(*puVar7 >> 0x11) & 1;
  iVar5 = (*(argSampler_local->super_TIntermNode)._vptr_TIntermNode[0xc])();
  newId = CONCAT44(extraout_var_03,iVar5);
  if (newId == 0) {
    iVar5 = (*(argSampler_local->super_TIntermNode)._vptr_TIntermNode[8])();
    plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 400))();
    newId = (**(code **)(*plVar8 + 0x60))();
  }
  if (newId == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,argTex_local,"unable to find texture symbol","");
    this_local = (HlslParseContext *)0x0;
  }
  else {
    p_Var9 = (_Base_ptr)(**(code **)(*(long *)newId + 0x180))();
    textureShadowEntry._M_node = p_Var9;
    local_70 = (**(code **)(*(long *)newId + 0x180))();
    iVar5 = (int)p_Var9;
    local_68._M_node =
         (_Base_ptr)
         std::
         map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
         ::find(&(this->textureShadowVariant).
                 super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                ,&local_70);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
         ::end(&(this->textureShadowVariant).
                super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              );
    bVar4 = std::operator!=(&local_68,&local_78);
    if (bVar4) {
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>
                ::operator->(&local_68);
      textureShadowEntry._M_node =
           (_Base_ptr)tShadowTextureSymbols::get(ppVar10->second,(bool)(texSymbol._3_1_ & 1));
    }
    else {
      tShadowTextureSymbols::tShadowTextureSymbols(&local_88);
      tVar15.symId._M_elems[1] = 1;
      tVar15.symId._M_elems[0] = local_88.symId._M_elems[1];
      ptVar11 = NewPoolObject<glslang::HlslParseContext::tShadowTextureSymbols>
                          ((glslang *)local_88.symId._M_elems[0],tVar15,iVar5);
      texType.spirvType = (TSpirvType *)(**(code **)(*(long *)newId + 0x180))();
      pptVar12 = std::
                 map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                 ::operator[](&(this->textureShadowVariant).
                               super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                              ,(key_type_conflict2 *)&texType.spirvType);
      *pptVar12 = ptVar11;
    }
    if (textureShadowEntry._M_node == (_Base_ptr)0xffffffffffffffff) {
      TType::TType((TType *)&newTexture,EbtVoid,EvqTemporary,1,0,0,false);
      iVar5 = (*(argSampler_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      TType::shallowCopy((TType *)&newTexture,(TType *)CONCAT44(extraout_var_05,iVar5));
      bVar2 = texSymbol._3_1_;
      pTVar13 = TType::getSampler((TType *)&newTexture);
      pTVar3 = argTex_local;
      *pTVar13 = (TSampler)((uint)*pTVar13 & 0xfffdffff | (uint)(bVar2 & 1) << 0x11);
      qualifier = TType::getQualifier((TType *)&newTexture);
      globalQualifierFix(this,(TSourceLoc *)pTVar3,qualifier);
      name = (TString *)(**(code **)(*(long *)newId + 400))();
      local_130 = makeInternalVariable(this,name,(TType *)&newTexture);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,local_130);
      iVar5 = (*(local_130->super_TSymbol)._vptr_TSymbol[0xf])();
      textureShadowEntry._M_node = (_Base_ptr)CONCAT44(extraout_var_06,iVar5);
      TType::~TType((TType *)&newTexture);
    }
    if (textureShadowEntry._M_node == (_Base_ptr)0xffffffffffffffff) {
      __assert_fail("newId != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xd2d,
                    "TIntermAggregate *glslang::HlslParseContext::handleSamplerTextureCombine(const TSourceLoc &, TIntermTyped *, TIntermTyped *)"
                   );
    }
    local_138._M_node =
         (_Base_ptr)
         std::
         map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
         ::find(&(this->textureShadowVariant).
                 super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                ,(key_type_conflict2 *)&textureShadowEntry);
    local_140._M_node =
         (_Base_ptr)
         std::
         map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
         ::end(&(this->textureShadowVariant).
                super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
              );
    bVar4 = std::operator==(&local_138,&local_140);
    if (bVar4) {
      local_148 = (**(code **)(*(long *)newId + 0x180))();
      pptVar12 = std::
                 map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                 ::operator[](&(this->textureShadowVariant).
                               super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                              ,&local_148);
      ptVar1 = *pptVar12;
      pptVar12 = std::
                 map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                 ::operator[](&(this->textureShadowVariant).
                               super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                              ,(key_type_conflict2 *)&textureShadowEntry);
      *pptVar12 = ptVar1;
    }
    pptVar12 = std::
               map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
               ::operator[](&(this->textureShadowVariant).
                             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                            ,(key_type_conflict2 *)&textureShadowEntry);
    tShadowTextureSymbols::set
              (*pptVar12,(bool)(texSymbol._3_1_ & 1),(longlong)textureShadowEntry._M_node);
    uVar14 = (uint)texSymbol._3_1_;
    iVar5 = (*(argSampler_local->super_TIntermNode)._vptr_TIntermNode[0x1f])();
    puVar7 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar5) + 0x48))();
    *puVar7 = *puVar7 & 0xfffdffff | (uVar14 & 1) << 0x11;
    texSymbol._4_4_ = texSymbol._4_4_ & 0xfffdffff | (uint)(texSymbol._3_1_ & 1) << 0x11;
    (**(code **)(*(long *)newId + 0x1a8))(newId,textureShadowEntry._M_node);
    pHVar6 = local_38;
    TType::TType(&local_1e0,(TSampler *)((long)&texSymbol + 4),EvqTemporary,(TArraySizes *)0x0);
    (*((TIntermNode *)&(pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)
      ->_vptr_TIntermNode[0x1d])(pHVar6,&local_1e0);
    TType::~TType(&local_1e0);
    (*((TIntermNode *)&(local_38->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
      )->_vptr_TIntermNode[1])(local_38,argTex_local);
    this_local = local_38;
  }
  return (TIntermAggregate *)this_local;
}

Assistant:

TIntermAggregate* HlslParseContext::handleSamplerTextureCombine(const TSourceLoc& loc, TIntermTyped* argTex,
                                                                TIntermTyped* argSampler)
{
    TIntermAggregate* txcombine = new TIntermAggregate(EOpConstructTextureSampler);

    txcombine->getSequence().push_back(argTex);
    txcombine->getSequence().push_back(argSampler);

    TSampler samplerType = argTex->getType().getSampler();
    samplerType.combined = true;

    // TODO:
    // This block exists until the spec no longer requires shadow modes on texture objects.
    // It can be deleted after that, along with the shadowTextureVariant member.
    {
        const bool shadowMode = argSampler->getType().getSampler().shadow;

        TIntermSymbol* texSymbol = argTex->getAsSymbolNode();

        if (texSymbol == nullptr)
            texSymbol = argTex->getAsBinaryNode()->getLeft()->getAsSymbolNode();

        if (texSymbol == nullptr) {
            error(loc, "unable to find texture symbol", "", "");
            return nullptr;
        }

        // This forces the texture's shadow state to be the sampler's
        // shadow state.  This depends on downstream optimization to
        // DCE one variant in [shadow, nonshadow] if both are present,
        // or the SPIR-V module would be invalid.
        long long newId = texSymbol->getId();

        // Check to see if this texture has been given a shadow mode already.
        // If so, look up the one we already have.
        const auto textureShadowEntry = textureShadowVariant.find(texSymbol->getId());

        if (textureShadowEntry != textureShadowVariant.end())
            newId = textureShadowEntry->second->get(shadowMode);
        else
            textureShadowVariant[texSymbol->getId()] = NewPoolObject(tShadowTextureSymbols(), 1);

        // Sometimes we have to create another symbol (if this texture has been seen before,
        // and we haven't created the form for this shadow mode).
        if (newId == -1) {
            TType texType;
            texType.shallowCopy(argTex->getType());
            texType.getSampler().shadow = shadowMode;  // set appropriate shadow mode.
            globalQualifierFix(loc, texType.getQualifier());

            TVariable* newTexture = makeInternalVariable(texSymbol->getName(), texType);

            trackLinkage(*newTexture);

            newId = newTexture->getUniqueId();
        }

        assert(newId != -1);

        if (textureShadowVariant.find(newId) == textureShadowVariant.end())
            textureShadowVariant[newId] = textureShadowVariant[texSymbol->getId()];

        textureShadowVariant[newId]->set(shadowMode, newId);

        // Remember this shadow mode in the texture and the merged type.
        argTex->getWritableType().getSampler().shadow = shadowMode;
        samplerType.shadow = shadowMode;

        texSymbol->switchId(newId);
    }

    txcombine->setType(TType(samplerType, EvqTemporary));
    txcombine->setLoc(loc);

    return txcombine;
}